

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

void parse_rockridge_SL1(file_info *file,uchar *data,int data_length)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  byte *pbVar4;
  archive_string *as;
  int in_EDX;
  char *in_RSI;
  long in_RDI;
  uchar nlen;
  uchar flag;
  char *separator;
  void *in_stack_ffffffffffffffc8;
  archive_string *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe8;
  
  if ((*(char *)(in_RDI + 0xf0) == '\0') || (*(long *)(in_RDI + 0xe0) == 0)) {
    *(undefined8 *)(in_RDI + 0xe0) = 0;
  }
  *(undefined1 *)(in_RDI + 0xf0) = 0;
  if (0 < in_EDX) {
    if (*in_RSI != '\0') {
      if (*in_RSI != '\x01') {
        return;
      }
      *(undefined1 *)(in_RDI + 0xf0) = 1;
    }
    pbVar4 = (byte *)(in_RSI + 1);
    for (iVar3 = in_EDX + -1; 1 < iVar3; iVar3 = iVar3 - (uint)bVar2) {
      bVar1 = *pbVar4;
      as = (archive_string *)(pbVar4 + 2);
      bVar2 = pbVar4[1];
      iVar3 = iVar3 + -2;
      archive_strcat(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      in_stack_ffffffffffffffd0 = (archive_string *)(ulong)bVar1;
      switch(in_stack_ffffffffffffffd0) {
      case (archive_string *)0x0:
        if (iVar3 < (int)(uint)bVar2) {
          return;
        }
        archive_strncat(as,(void *)CONCAT44(iVar3,in_stack_ffffffffffffffe8),0x1c141e);
        break;
      case (archive_string *)0x1:
        if (iVar3 < (int)(uint)bVar2) {
          return;
        }
        archive_strncat(as,(void *)CONCAT44(iVar3,in_stack_ffffffffffffffe8),0x1c141e);
        break;
      case (archive_string *)0x2:
        archive_strcat(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
        break;
      default:
        return;
      case (archive_string *)0x4:
        archive_strcat(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
        break;
      case (archive_string *)0x8:
        archive_strcat(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
        break;
      case (archive_string *)0x10:
        *(undefined8 *)(in_RDI + 0xe0) = 0;
        archive_strcat(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
        break;
      case (archive_string *)0x20:
        archive_strcat(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      }
      pbVar4 = (byte *)((long)&as->s + (long)(int)(uint)bVar2);
    }
  }
  return;
}

Assistant:

static void
parse_rockridge_SL1(struct file_info *file, const unsigned char *data,
    int data_length)
{
	const char *separator = "";

	if (!file->symlink_continues || file->symlink.length < 1)
		archive_string_empty(&file->symlink);
	file->symlink_continues = 0;

	/*
	 * Defined flag values:
	 *  0: This is the last SL record for this symbolic link
	 *  1: this symbolic link field continues in next SL entry
	 *  All other values are reserved.
	 */
	if (data_length < 1)
		return;
	switch(*data) {
	case 0:
		break;
	case 1:
		file->symlink_continues = 1;
		break;
	default:
		return;
	}
	++data;  /* Skip flag byte. */
	--data_length;

	/*
	 * SL extension body stores "components".
	 * Basically, this is a complicated way of storing
	 * a POSIX path.  It also interferes with using
	 * symlinks for storing non-path data. <sigh>
	 *
	 * Each component is 2 bytes (flag and length)
	 * possibly followed by name data.
	 */
	while (data_length >= 2) {
		unsigned char flag = *data++;
		unsigned char nlen = *data++;
		data_length -= 2;

		archive_strcat(&file->symlink, separator);
		separator = "/";

		switch(flag) {
		case 0: /* Usual case, this is text. */
			if (data_length < nlen)
				return;
			archive_strncat(&file->symlink,
			    (const char *)data, nlen);
			break;
		case 0x01: /* Text continues in next component. */
			if (data_length < nlen)
				return;
			archive_strncat(&file->symlink,
			    (const char *)data, nlen);
			separator = "";
			break;
		case 0x02: /* Current dir. */
			archive_strcat(&file->symlink, ".");
			break;
		case 0x04: /* Parent dir. */
			archive_strcat(&file->symlink, "..");
			break;
		case 0x08: /* Root of filesystem. */
			archive_strcat(&file->symlink, "/");
			separator = "";
			break;
		case 0x10: /* Undefined (historically "volume root" */
			archive_string_empty(&file->symlink);
			archive_strcat(&file->symlink, "ROOT");
			break;
		case 0x20: /* Undefined (historically "hostname") */
			archive_strcat(&file->symlink, "hostname");
			break;
		default:
			/* TODO: issue a warning ? */
			return;
		}
		data += nlen;
		data_length -= nlen;
	}
}